

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O2

lysc_when *** lysc_node_when_p(lysc_node *node)

{
  uint16_t uVar1;
  lys_module **pplVar2;
  
  if (node == (lysc_node *)0x0) {
    return (lysc_when ***)0x0;
  }
  uVar1 = node->nodetype;
  switch(uVar1) {
  case 2:
  case 4:
  case 8:
switchD_0015decb_caseD_2:
    pplVar2 = &node[1].module;
    break;
  case 3:
  case 5:
  case 6:
  case 7:
    return (lysc_when ***)0x0;
  default:
    if (uVar1 != 0x10) {
      if (((uVar1 == 0x20) || (uVar1 == 0x60)) || (uVar1 == 0x80)) goto switchD_0015decb_caseD_2;
      if ((uVar1 == 0x100) || (uVar1 == 0x200)) {
        return (lysc_when ***)(node + 1);
      }
      if (uVar1 != 0x400) {
        return (lysc_when ***)0x0;
      }
    }
  case 1:
    pplVar2 = (lys_module **)&node[1].parent;
  }
  return (lysc_when ***)pplVar2;
}

Assistant:

struct lysc_when ***
lysc_node_when_p(const struct lysc_node *node)
{
    if (!node) {
        return NULL;
    }

    switch (node->nodetype) {
    case LYS_CONTAINER:
        return &((struct lysc_node_container *)node)->when;
    case LYS_CHOICE:
        return &((struct lysc_node_choice *)node)->when;
    case LYS_LEAF:
        return &((struct lysc_node_leaf *)node)->when;
    case LYS_LEAFLIST:
        return &((struct lysc_node_leaflist *)node)->when;
    case LYS_LIST:
        return &((struct lysc_node_list *)node)->when;
    case LYS_ANYXML:
    case LYS_ANYDATA:
        return &((struct lysc_node_anydata *)node)->when;
    case LYS_CASE:
        return &((struct lysc_node_case *)node)->when;
    case LYS_NOTIF:
        return &((struct lysc_node_notif *)node)->when;
    case LYS_RPC:
    case LYS_ACTION:
        return &((struct lysc_node_action *)node)->when;
    default:
        return NULL;
    }
}